

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

void __thiscall
dd::ProcessThreadImpl::PostDelayedTask
          (ProcessThreadImpl *this,
          unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task,
          uint32_t milliseconds)

{
  pointer pDVar1;
  bool bVar2;
  rep rVar3;
  int64_t run_at_ms;
  long local_30;
  
  rVar3 = GetCurrentTick();
  local_30 = (ulong)milliseconds + rVar3;
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  pDVar1 = (this->_delayed_tasks).c.
           super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pDVar1 == (this->_delayed_tasks).c.
                super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    bVar2 = (long)((ulong)milliseconds + rVar3) < pDVar1->run_at_ms;
  }
  std::
  priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
  ::emplace<long&,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>
            ((priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
              *)&this->_delayed_tasks,&local_30,task);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  if (bVar2) {
    Event::Set(&this->_wake_up);
  }
  return;
}

Assistant:

void ProcessThreadImpl::PostDelayedTask(std::unique_ptr<QueuedTask> task, uint32_t milliseconds) {
		int64_t run_at_ms = GetCurrentTick() + milliseconds;
		bool recalulate_wakeup_time = false;
		{
			AutoLock l(_lock);
			recalulate_wakeup_time = _delayed_tasks.empty() || run_at_ms < _delayed_tasks.top().run_at_ms;
			_delayed_tasks.emplace(run_at_ms, std::move(task));
		}
		if (recalulate_wakeup_time) {
			_wake_up.Set();
		}
	}